

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestLazyMessage::~TestLazyMessage(TestLazyMessage *this)

{
  TestLazyMessage *this_local;
  
  ~TestLazyMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestLazyMessage::~TestLazyMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestLazyMessage)
  SharedDtor(*this);
}